

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::make_huff_table(jpeg_decoder *this,int index,huff_tables *pH)

{
  byte bVar1;
  byte bVar2;
  uint8 *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  uint8 huffsize [258];
  uint huffcode [258];
  byte local_548 [272];
  uint local_438 [258];
  
  pH->ac_table = this->m_huff_ac[index] != '\0';
  puVar3 = this->m_huff_num[index];
  uVar18 = 0;
  lVar8 = 1;
  do {
    bVar1 = puVar3[lVar8];
    if (bVar1 != 0) {
      uVar12 = 0x101;
      if (0x101 < (int)uVar18) {
        uVar12 = (ulong)uVar18;
      }
      lVar16 = 0;
      do {
        if (uVar12 - (long)(int)uVar18 == lVar16) goto LAB_001dad02;
        local_548[lVar16 + (int)uVar18] = (byte)lVar8;
        lVar16 = lVar16 + 1;
      } while ((uint)bVar1 != (uint)lVar16);
      uVar18 = uVar18 + (uint)lVar16;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  if (0x101 < (int)uVar18) {
    __assert_fail("p < 258",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                  ,0x8c6,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
  }
  local_548[(int)uVar18] = 0;
  uVar5 = (uint)local_548[0];
  if (local_548[0] != 0) {
    uVar7 = 0;
    iVar11 = 0;
    do {
      lVar8 = (long)(int)uVar7;
      if (uVar5 == local_548[lVar8]) {
        uVar12 = 0x101;
        if (0x101 < (int)uVar7) {
          uVar12 = (ulong)uVar7;
        }
        lVar16 = 0;
        do {
          if (uVar12 - lVar8 == lVar16) goto LAB_001dad02;
          local_438[lVar8 + lVar16] = iVar11 + (int)lVar16;
          lVar4 = lVar16 + lVar8;
          lVar16 = lVar16 + 1;
        } while (uVar5 == local_548[lVar4 + 1]);
        uVar7 = uVar7 + (int)lVar16;
        iVar11 = iVar11 + (int)lVar16;
      }
      iVar11 = iVar11 * 2;
      uVar5 = uVar5 + 1;
    } while (local_548[(int)uVar7] != 0);
  }
  memset(pH->look_up,0,0x1100);
  if (0 < (int)uVar18) {
    uVar13 = 0xffffffff;
    uVar12 = 0;
    do {
      bVar1 = this->m_huff_val[index][uVar12];
      uVar5 = local_438[uVar12];
      bVar2 = local_548[uVar12];
      pH->code_size[bVar1] = bVar2;
      uVar15 = (uint)bVar2;
      uVar7 = (uint)bVar1;
      if (uVar15 < 9) {
        uVar5 = uVar5 << (8 - bVar2 & 0x1f);
        uVar17 = (ulong)uVar5;
        bVar19 = (bVar1 & 0xf) != 0;
        uVar6 = (bVar1 & 0xf) + (uint)bVar2;
        if (uVar5 < 0x101) {
          uVar5 = 0x100;
        }
        iVar11 = (1 << (8 - bVar2 & 0x1f)) + 1;
        do {
          if (uVar5 == uVar17) goto LAB_001dad02;
          pH->look_up[uVar17] = uVar7;
          uVar9 = 0;
          uVar10 = uVar15;
          if (uVar6 < 9 && bVar19) {
            uVar9 = ((uint)uVar17 >> (8U - (char)uVar6 & 0x1f) & ~(-1 << (sbyte)(bVar1 & 0xf))) <<
                    0x10;
            uVar10 = uVar6;
          }
          uVar10 = uVar10 << 8 | uVar7;
          uVar14 = uVar9 | uVar10 | 0x8000;
          if (uVar6 >= 9 || !bVar19) {
            uVar14 = uVar10;
          }
          pH->look_up2[uVar17] = uVar14;
          uVar17 = uVar17 + 1;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
      }
      else {
        uVar6 = uVar5 >> (bVar2 - 8 & 0x1f) & 0xff;
        uVar14 = pH->look_up[uVar6];
        if (uVar14 == 0) {
          pH->look_up[uVar6] = uVar13;
          pH->look_up2[uVar6] = uVar13;
          uVar14 = uVar13;
          uVar13 = uVar13 - 2;
        }
        uVar5 = uVar5 << (0x18 - bVar2 & 0x1f);
        if (uVar15 != 9) {
          iVar11 = uVar15 + 1;
          do {
            uVar15 = (uVar14 - 1) + (uint)((uVar5 >> 0xf & 1) != 0);
            if (uVar15 < 0xfffffe00) goto LAB_001dad02;
            uVar15 = ~uVar15;
            uVar14 = pH->tree[uVar15];
            if (uVar14 == 0) {
              pH->tree[uVar15] = uVar13;
              uVar14 = uVar13;
              uVar13 = uVar13 - 2;
            }
            uVar5 = uVar5 * 2;
            iVar11 = iVar11 + -1;
          } while (10 < iVar11);
        }
        uVar5 = (uVar14 - 1) + (uint)((uVar5 >> 0xf & 1) != 0);
        if ((int)uVar5 < -0x200) {
LAB_001dad02:
          stop_decoding(this,JPGD_DECODE_ERROR);
        }
        pH->tree[(int)~uVar5] = uVar7;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar18);
  }
  return;
}

Assistant:

void jpeg_decoder::make_huff_table(int index, huff_tables* pH)
	{
		int p, i, l, si;
		uint8 huffsize[258];
		uint huffcode[258];
		uint code;
		uint subtree;
		int code_size;
		int lastp;
		int nextfreeentry;
		int currententry;

		pH->ac_table = m_huff_ac[index] != 0;

		p = 0;

		for (l = 1; l <= 16; l++)
		{
			for (i = 1; i <= m_huff_num[index][l]; i++)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffsize[p++] = static_cast<uint8>(l);
			}
		}

		assert(p < 258);
		huffsize[p] = 0;

		lastp = p;

		code = 0;
		si = huffsize[0];
		p = 0;

		while (huffsize[p])
		{
			while (huffsize[p] == si)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffcode[p++] = code;
				code++;
			}

			code <<= 1;
			si++;
		}

		memset(pH->look_up, 0, sizeof(pH->look_up));
		memset(pH->look_up2, 0, sizeof(pH->look_up2));
		memset(pH->tree, 0, sizeof(pH->tree));
		memset(pH->code_size, 0, sizeof(pH->code_size));

		nextfreeentry = -1;

		p = 0;

		while (p < lastp)
		{
			i = m_huff_val[index][p];

			code = huffcode[p];
			code_size = huffsize[p];

			assert(i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			pH->code_size[i] = static_cast<uint8>(code_size);

			if (code_size <= 8)
			{
				code <<= (8 - code_size);

				for (l = 1 << (8 - code_size); l > 0; l--)
				{
					if (code >= 256)
						stop_decoding(JPGD_DECODE_ERROR);

					pH->look_up[code] = i;

					bool has_extrabits = false;
					int extra_bits = 0;
					int num_extra_bits = i & 15;

					int bits_to_fetch = code_size;
					if (num_extra_bits)
					{
						int total_codesize = code_size + num_extra_bits;
						if (total_codesize <= 8)
						{
							has_extrabits = true;
							extra_bits = ((1 << num_extra_bits) - 1) & (code >> (8 - total_codesize));

							if (extra_bits > 0x7FFF)
								stop_decoding(JPGD_DECODE_ERROR);

							bits_to_fetch += num_extra_bits;
						}
					}

					if (!has_extrabits)
						pH->look_up2[code] = i | (bits_to_fetch << 8);
					else
						pH->look_up2[code] = i | 0x8000 | (extra_bits << 16) | (bits_to_fetch << 8);

					code++;
				}
			}
			else
			{
				subtree = (code >> (code_size - 8)) & 0xFF;

				currententry = pH->look_up[subtree];

				if (currententry == 0)
				{
					pH->look_up[subtree] = currententry = nextfreeentry;
					pH->look_up2[subtree] = currententry = nextfreeentry;

					nextfreeentry -= 2;
				}

				code <<= (16 - (code_size - 8));

				for (l = code_size; l > 9; l--)
				{
					if ((code & 0x8000) == 0)
						currententry--;

					unsigned int idx = -currententry - 1;

					if (idx >= JPGD_HUFF_TREE_MAX_LENGTH)
						stop_decoding(JPGD_DECODE_ERROR);

					if (pH->tree[idx] == 0)
					{
						pH->tree[idx] = nextfreeentry;

						currententry = nextfreeentry;

						nextfreeentry -= 2;
					}
					else
					{
						currententry = pH->tree[idx];
					}

					code <<= 1;
				}

				if ((code & 0x8000) == 0)
					currententry--;

				if ((-currententry - 1) >= JPGD_HUFF_TREE_MAX_LENGTH)
					stop_decoding(JPGD_DECODE_ERROR);

				pH->tree[-currententry - 1] = i;
			}

			p++;
		}
	}